

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  undefined8 uVar1;
  Enum EVar2;
  pointer pTVar3;
  ulong uVar4;
  Enum EVar5;
  pointer pTVar6;
  Enum EVar7;
  byte bVar8;
  ErrorLevel local_cc;
  TypeVector *local_c8;
  char *local_c0;
  Location *local_b8;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_b0;
  TypeVector *local_a8;
  Type local_a0;
  Type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pTVar3 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar6 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = actual;
  if ((long)pTVar6 - (long)pTVar3 >> 3 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    if (pTVar6 == pTVar3) {
      EVar2 = Ok;
    }
    else {
      bVar8 = 0;
      uVar4 = 0;
      local_c8 = expected;
      local_c0 = desc;
      local_b8 = loc;
      local_b0 = (vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind;
      do {
        local_98 = pTVar3[uVar4];
        local_a0 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar4];
        EVar5 = local_98.enum_;
        EVar7 = local_a0.enum_;
        if (EVar5 != EVar7) {
          local_cc = Error;
          Type::GetName_abi_cxx11_(&local_70,&local_98);
          uVar1 = CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_);
          Type::GetName_abi_cxx11_(&local_50,&local_a0);
          StringPrintf_abi_cxx11_
                    (&local_90,"type mismatch for %s %u of %s. got %s, expected %s",local_c0,
                     uVar4 & 0xffffffff,"function",uVar1,local_50._M_dataplus._M_p);
          std::vector<wabt::Error,std::allocator<wabt::Error>>::
          emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                    (local_b0,&local_cc,local_b8,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_
                                    ),local_70.field_2._M_allocated_capacity + 1);
          }
          pTVar3 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar6 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          expected = local_c8;
        }
        bVar8 = bVar8 | EVar5 != EVar7;
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)pTVar6 - (long)pTVar3 >> 3));
      EVar2 = (Enum)bVar8;
    }
  }
  else {
    local_70._M_dataplus._M_p._0_4_ = 1;
    StringPrintf_abi_cxx11_(&local_90,"expected %zd %ss, got %zd");
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind,(ErrorLevel *)&local_70
               ,loc,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    EVar2 = Error;
  }
  return (Result)EVar2;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}